

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.hpp
# Opt level: O1

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::flatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (jsonpath *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar2;
  string_type parent_key;
  string_type local_38;
  
  *(undefined2 *)this = 4;
  local_38.field_2._M_allocated_capacity._0_2_ = 0x24;
  local_38._M_string_length = 1;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (&local_38,value,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  uVar1 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT62(local_38.field_2._M_allocated_capacity._2_6_,
                             local_38.field_2._M_allocated_capacity._0_2_) + 1);
    uVar1 = extraout_RDX_00;
  }
  bVar2.field_0.int64_.val_ = uVar1;
  bVar2.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar2.field_0;
}

Assistant:

Json flatten(const Json& value)
    {
        Json result;
        typename Json::string_type parent_key = {'$'};
        flatten_(parent_key, value, result);
        return result;
    }